

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

bool __thiscall
QDialogButtonBoxPrivate::handleButtonShowAndHide
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,QEvent *event)

{
  QVarLengthFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_8> *this_00;
  ButtonRole role_00;
  long in_FS_OFFSET;
  const_iterator cVar1;
  ButtonRole role;
  ButtonRole local_4c;
  QAbstractButton *local_48;
  pair<QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>::iterator,_bool>
  local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = button;
  if ((0xfffffffd < *(ushort *)(event + 8) - 0x1c) && (this->ignoreShowAndHide == false)) {
    if (*(ushort *)(event + 8) == 0x1b) {
      local_4c = QDialogButtonBox::buttonRole
                           (*(QDialogButtonBox **)&(this->super_QWidgetPrivate).field_0x8,button);
      if (local_4c != InvalidRole) {
        removeButton(this,button,HideEvent);
        QFlatMap<QAbstractButton*,QDialogButtonBox::ButtonRole,std::less<QAbstractButton*>,QVarLengthArray<QAbstractButton*,8ll>,QVarLengthArray<QDialogButtonBox::ButtonRole,8ll>>
        ::try_emplace<QDialogButtonBox::ButtonRole_const&>
                  (&local_40,&this->hiddenButtons,&local_48,&local_4c);
        layoutButtons(this);
      }
    }
    else {
      this_00 = &this->hiddenButtons;
      cVar1 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
              ::find(this_00,&local_48);
      if ((cVar1.c != &this_00->c) ||
         (cVar1.i !=
          (this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s)) {
        role_00 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                  ::take(this_00,&local_48);
        addButton(this,local_48,role_00,DoLayout,SkipConnect);
        if (role_00 == AcceptRole) {
          ensureFirstAcceptIsDefault(this);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QDialogButtonBoxPrivate::handleButtonShowAndHide(QAbstractButton *button, QEvent *event)
{
    Q_Q(QDialogButtonBox);

    const QEvent::Type type = event->type();

    if ((type != QEvent::HideToParent && type != QEvent::ShowToParent) || ignoreShowAndHide)
        return false;

    switch (type) {
    case QEvent::HideToParent: {
        const QDialogButtonBox::ButtonRole role = q->buttonRole(button);
        if (role != QDialogButtonBox::ButtonRole::InvalidRole) {
            removeButton(button, RemoveReason::HideEvent);
            hiddenButtons.insert(button, role);
            layoutButtons();
        }
        break;
    }
    case QEvent::ShowToParent:
        if (hiddenButtons.contains(button)) {
            const auto role = hiddenButtons.take(button);
            addButton(button, role, LayoutRule::DoLayout, AddRule::SkipConnect);
            if (role == QDialogButtonBox::AcceptRole)
                ensureFirstAcceptIsDefault();
        }
        break;
    default: break;
    }

    return false;
}